

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeString::toUTF8(UnicodeString *this,ByteSink *sink)

{
  uint destCapacity;
  int32_t destCapacity_00;
  UBool UVar1;
  uint srcLength;
  int iVar2;
  undefined4 extraout_var;
  char16_t *pcVar3;
  char *dest;
  uint local_454;
  UErrorCode local_440;
  uint local_43c;
  UErrorCode errorCode;
  int32_t length8;
  char *utf8;
  undefined1 local_428 [3];
  UBool utf8IsOwned;
  int32_t capacity;
  char stackBuffer [1024];
  int32_t length16;
  ByteSink *sink_local;
  UnicodeString *this_local;
  
  srcLength = length(this);
  if (srcLength != 0) {
    utf8._4_4_ = 0x400;
    utf8._3_1_ = '\0';
    local_454 = srcLength;
    if (0x3ff < (int)srcLength) {
      local_454 = 0x400;
    }
    iVar2 = (*sink->_vptr_ByteSink[3])
                      (sink,(ulong)local_454,(ulong)(srcLength * 3),local_428,0x400,(long)&utf8 + 4)
    ;
    destCapacity_00 = utf8._4_4_;
    local_43c = 0;
    local_440 = U_ZERO_ERROR;
    _errorCode = (char *)CONCAT44(extraout_var,iVar2);
    pcVar3 = getBuffer(this);
    u_strToUTF8WithSub_63
              ((char *)CONCAT44(extraout_var,iVar2),destCapacity_00,(int32_t *)&local_43c,pcVar3,
               srcLength,0xfffd,(int32_t *)0x0,&local_440);
    if (local_440 == U_BUFFER_OVERFLOW_ERROR) {
      dest = (char *)uprv_malloc_63((long)(int)local_43c);
      destCapacity = local_43c;
      _errorCode = dest;
      if (dest == (char *)0x0) {
        local_440 = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        utf8._3_1_ = '\x01';
        local_440 = U_ZERO_ERROR;
        pcVar3 = getBuffer(this);
        u_strToUTF8WithSub_63
                  (dest,destCapacity,(int32_t *)&local_43c,pcVar3,srcLength,0xfffd,(int32_t *)0x0,
                   &local_440);
      }
    }
    UVar1 = ::U_SUCCESS(local_440);
    if (UVar1 != '\0') {
      (*sink->_vptr_ByteSink[2])(sink,_errorCode,(ulong)local_43c);
      (*sink->_vptr_ByteSink[4])();
    }
    if (utf8._3_1_ != '\0') {
      uprv_free_63(_errorCode);
    }
  }
  return;
}

Assistant:

void
UnicodeString::toUTF8(ByteSink &sink) const {
  int32_t length16 = length();
  if(length16 != 0) {
    char stackBuffer[1024];
    int32_t capacity = (int32_t)sizeof(stackBuffer);
    UBool utf8IsOwned = FALSE;
    char *utf8 = sink.GetAppendBuffer(length16 < capacity ? length16 : capacity,
                                      3*length16,
                                      stackBuffer, capacity,
                                      &capacity);
    int32_t length8 = 0;
    UErrorCode errorCode = U_ZERO_ERROR;
    u_strToUTF8WithSub(utf8, capacity, &length8,
                       getBuffer(), length16,
                       0xFFFD,  // Standard substitution character.
                       NULL,    // Don't care about number of substitutions.
                       &errorCode);
    if(errorCode == U_BUFFER_OVERFLOW_ERROR) {
      utf8 = (char *)uprv_malloc(length8);
      if(utf8 != NULL) {
        utf8IsOwned = TRUE;
        errorCode = U_ZERO_ERROR;
        u_strToUTF8WithSub(utf8, length8, &length8,
                           getBuffer(), length16,
                           0xFFFD,  // Standard substitution character.
                           NULL,    // Don't care about number of substitutions.
                           &errorCode);
      } else {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    if(U_SUCCESS(errorCode)) {
      sink.Append(utf8, length8);
      sink.Flush();
    }
    if(utf8IsOwned) {
      uprv_free(utf8);
    }
  }
}